

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

put_transaction<int_(Struct::*)()> * __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
::
start_emplace<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)(),int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
          (put_transaction<int_(Struct::*)()> *__return_storage_ptr__,
          heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
          *this,offset_in_Struct_to_subr *i_construction_params)

{
  uintptr_t uVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)> *pFVar2;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)> FVar3;
  put_transaction<int_(Struct::*)()> local_58;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)> *local_40;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)> *type_storage;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)> *type;
  Allocation push_data;
  offset_in_Struct_to_subr *i_construction_params_local;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  push_data.m_user_storage = i_construction_params;
  _type = inplace_allocate<0ul,true,16ul,8ul>(this);
  type_storage = (FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)> *)0x0;
  pFVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
           ::type_after_control((ControlBlock *)type);
  local_40 = pFVar2;
  FVar3 = detail::
          FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>
          ::
          make<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
                    ();
  *pFVar2 = FVar3;
  uVar1 = *push_data.m_user_storage;
  push_data.m_control_block[1].m_next = *(uintptr_t *)((long)push_data.m_user_storage + 8);
  (push_data.m_control_block)->m_next = uVar1;
  type_storage = pFVar2;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<int_(Struct::*)()>::put_transaction
            (&local_58,0,
             (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
              *)this,_type);
  put_transaction<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
  ::
  put_transaction<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)(),void>
            ((put_transaction<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
              *)__return_storage_ptr__,&local_58);
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<int_(Struct::*)()>::~put_transaction(&local_58);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              0,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }